

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_heart_Printer.h
# Opt level: O0

void __thiscall
soul::heart::Printer::PrinterStream::printValue(soul::Value_const&)::Printer::
printStringLiteral(choc::value::StringDictionary::Handle_(void *this,Handle h)

{
  char *in_RCX;
  undefined1 auVar1 [16];
  string_view text;
  string local_48;
  undefined1 local_28 [16];
  void *local_18;
  Printer *this_local;
  Handle h_local;
  
  local_18 = this;
  this_local._4_4_ = h.handle;
  if (*(long *)((long)this + 8) == 0) {
    std::__cxx11::to_string(&local_48,h.handle);
  }
  else {
    auVar1 = (**(code **)(**(long **)((long)this + 8) + 0x18))(*(long **)((long)this + 8),h.handle);
    text._M_len = auVar1._8_8_;
    text._M_str = in_RCX;
    toHeartStringLiteral_abi_cxx11_(&local_48,auVar1._0_8_,text);
  }
  local_28 = std::__cxx11::string::operator_cast_to_basic_string_view((string *)&local_48);
  (**(code **)(*this + 0x98))(this,local_28._0_8_,local_28._8_8_);
  std::__cxx11::string::~string((string *)&local_48);
  return;
}

Assistant:

void printStringLiteral (StringDictionary::Handle h) override
                {
                    print (dictionary != nullptr ? toHeartStringLiteral (dictionary->getStringForHandle (h))
                                                 : std::to_string (h.handle));
                }